

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::SPxQuicksort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start,bool type)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  
  if (end <= start + 1) {
    return;
  }
  uVar17 = end - 1;
LAB_001c97ce:
  uVar7 = uVar17 - start;
  if ((int)uVar7 < 0x19) {
    if ((int)uVar7 < 1) {
      return;
    }
    SPxShellsort<int,soplex::Compare<double>>(keys,uVar17,compare,start);
    return;
  }
  iVar8 = (uVar7 >> 1) + start;
  iVar3 = keys[iVar8];
  lVar11 = (long)(int)uVar17;
  lVar12 = (long)start;
  uVar9 = uVar17;
  uVar7 = start;
LAB_001c97f2:
  uVar10 = (ulong)uVar9;
  pdVar5 = compare->weight;
  uVar15 = (ulong)(int)uVar7;
  uVar18 = uVar17;
  if ((int)uVar17 < (int)uVar7) {
    uVar18 = uVar7;
  }
  uVar16 = (ulong)uVar18;
  if ((type & 1U) == 0) {
    uVar13 = (ulong)(int)uVar9;
    for (; (long)uVar15 < lVar11; uVar15 = uVar15 + 1) {
      dVar1 = pdVar5[keys[uVar15]];
      dVar2 = pdVar5[iVar3];
      if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (0.0 < dVar1 - dVar2)) {
        uVar16 = uVar15 & 0xffffffff;
        break;
      }
    }
    if (start <= (int)uVar9) {
      uVar10 = (ulong)(uint)start;
    }
    for (; lVar12 < (long)uVar13; uVar13 = uVar13 - 1) {
      if (pdVar5[keys[uVar13]] < pdVar5[iVar3] || pdVar5[keys[uVar13]] == pdVar5[iVar3])
      goto LAB_001c98ae;
    }
  }
  else {
    for (; (long)uVar15 < lVar11; uVar15 = uVar15 + 1) {
      if (pdVar5[iVar3] < pdVar5[keys[uVar15]] || pdVar5[iVar3] == pdVar5[keys[uVar15]]) {
        uVar16 = uVar15 & 0xffffffff;
        break;
      }
    }
    uVar13 = (ulong)(int)uVar9;
    if (start <= (int)uVar9) {
      uVar10 = (ulong)(uint)start;
    }
    for (; lVar12 < (long)uVar13; uVar13 = uVar13 - 1) {
      dVar1 = pdVar5[keys[uVar13]];
      dVar2 = pdVar5[iVar3];
      if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (dVar1 - dVar2 < 0.0))
      goto LAB_001c98ae;
    }
  }
  goto LAB_001c98b1;
LAB_001c98ae:
  uVar10 = uVar13 & 0xffffffff;
LAB_001c98b1:
  uVar7 = (uint)uVar16;
  uVar9 = (uint)uVar10;
  if ((int)uVar9 <= (int)uVar7) goto LAB_001c98d6;
  iVar4 = keys[(int)uVar7];
  keys[(int)uVar7] = keys[(int)uVar9];
  keys[(int)uVar9] = iVar4;
  uVar7 = uVar7 + 1;
  uVar9 = uVar9 - 1;
  goto LAB_001c97f2;
LAB_001c98d6:
  if ((type & 1U) == 0) {
    lVar14 = (long)(int)uVar9;
    if (start <= (int)uVar9) {
      uVar10 = (ulong)(uint)start;
    }
    for (; uVar9 = (uint)uVar10, lVar12 < lVar14; lVar14 = lVar14 + -1) {
      dVar1 = pdVar5[iVar3];
      dVar2 = pdVar5[keys[lVar14]];
      if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (0.0 < dVar1 - dVar2)) {
        uVar9 = (uint)lVar14;
        break;
      }
    }
    if (uVar9 == uVar17) {
      iVar3 = keys[lVar11];
      keys[lVar11] = keys[iVar8];
      keys[iVar8] = iVar3;
      uVar9 = uVar17 - 1;
    }
  }
  else {
    lVar14 = (long)(int)uVar7;
    if ((int)uVar7 <= (int)uVar17) {
      uVar16 = (ulong)uVar17;
    }
    for (; uVar7 = (uint)uVar16, lVar14 < lVar11; lVar14 = lVar14 + 1) {
      dVar1 = pdVar5[iVar3];
      dVar2 = pdVar5[keys[lVar14]];
      if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && (dVar1 - dVar2 < 0.0)) {
        uVar7 = (uint)lVar14;
        break;
      }
    }
    if (uVar7 == start) {
      iVar3 = keys[lVar12];
      keys[lVar12] = keys[iVar8];
      keys[iVar8] = iVar3;
      uVar7 = start + 1;
    }
  }
  if ((int)(uVar17 - uVar7) < (int)(uVar9 - start)) {
    bVar6 = (int)uVar17 <= (int)uVar7;
    uVar18 = uVar9;
    uVar9 = uVar17;
    uVar17 = uVar7;
    uVar7 = start;
    if (bVar6) goto LAB_001c99c8;
  }
  else {
    bVar6 = (int)uVar9 <= start;
    uVar18 = uVar17;
    uVar17 = start;
    start = uVar7;
    if (bVar6) goto LAB_001c99c8;
  }
  SPxQuicksort<int,soplex::Compare<double>>(keys,uVar9 + 1,compare,uVar17,(bool)(~type & 1));
  start = uVar7;
LAB_001c99c8:
  uVar17 = uVar18;
  type = (bool)(type ^ 1);
  goto LAB_001c97ce;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}